

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::arrayOfArrayVersionCheck
          (TParseContext *this,TSourceLoc *loc,TArraySizes *sizes)

{
  int iVar1;
  char *feature;
  TArraySizes *sizes_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  if ((sizes != (TArraySizes *)0x0) && (iVar1 = TArraySizes::getNumDims(sizes), iVar1 != 1)) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"arrays of arrays");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,8,0x136,(char *)0x0,"arrays of arrays");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x1ae,(char *)0x0,"arrays of arrays");
  }
  return;
}

Assistant:

void TParseContext::arrayOfArrayVersionCheck(const TSourceLoc& loc, const TArraySizes* sizes)
{
    if (sizes == nullptr || sizes->getNumDims() == 1)
        return;

    const char* feature = "arrays of arrays";

    requireProfile(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, feature);
    profileRequires(loc, EEsProfile, 310, nullptr, feature);
    profileRequires(loc, ECoreProfile | ECompatibilityProfile, 430, nullptr, feature);
}